

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O3

void __thiscall
OpenMD::RadialDistrFunc::processNonOverlapping
          (RadialDistrFunc *this,SelectionManager *sman1,SelectionManager *sman2)

{
  StuntDouble *pSVar1;
  StuntDouble *pSVar2;
  int i;
  int j;
  int iStack_38;
  int local_34;
  
  pSVar1 = SelectionManager::beginSelected(sman1,&iStack_38);
  if (pSVar1 != (StuntDouble *)0x0) {
    do {
      pSVar2 = SelectionManager::beginSelected(sman2,&local_34);
      while (pSVar2 != (StuntDouble *)0x0) {
        (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[9])(this,pSVar1,pSVar2);
        pSVar2 = SelectionManager::nextSelected(sman2,&local_34);
      }
      pSVar1 = SelectionManager::nextSelected(sman1,&iStack_38);
    } while (pSVar1 != (StuntDouble *)0x0);
  }
  return;
}

Assistant:

void RadialDistrFunc::processNonOverlapping(SelectionManager& sman1,
                                              SelectionManager& sman2) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    int i;
    int j;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    for (sd1 = sman1.beginSelected(i); sd1 != NULL;
         sd1 = sman1.nextSelected(i)) {
      for (sd2 = sman2.beginSelected(j); sd2 != NULL;
           sd2 = sman2.nextSelected(j)) {
        collectHistogram(sd1, sd2);
      }
    }
  }